

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall
cppcms::application::translate_abi_cxx11_(application *this,char *ctx,char *message)

{
  basic_message<char> *in_RSI;
  basic_message<char> *in_RDI;
  locale local_a8 [32];
  application *in_stack_ffffffffffffff78;
  
  booster::locale::translate<char>((char *)in_RSI,(char *)in_RDI);
  context(in_stack_ffffffffffffff78);
  http::context::locale((context *)in_RSI);
  booster::locale::basic_message<char>::str_abi_cxx11_(in_RSI,(locale *)in_RDI);
  std::locale::~locale(local_a8);
  booster::locale::basic_message<char>::~basic_message(in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string application::translate(char const *ctx,char const *message)
{
	return booster::locale::translate(ctx,message).str(context().locale());
}